

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O3

void telnet_subnegotiation(telnet_t *telnet,uchar telopt,char *buffer,size_t size)

{
  uchar bytes [5];
  char local_5d [3];
  char local_5a [2];
  telnet_event_t local_58;
  
  local_5d[0] = -1;
  local_5d[1] = -6;
  local_5a[0] = -1;
  local_5a[1] = -0x10;
  local_58.type = TELNET_EV_SEND;
  local_58.data.buffer = local_5d;
  local_58.data.size = 3;
  local_5d[2] = telopt;
  (*telnet->eh)(telnet,&local_58,telnet->ud);
  telnet_send(telnet,buffer,size);
  local_58.type = TELNET_EV_SEND;
  local_58.data.size = 2;
  local_58.data.buffer = local_5a;
  (*telnet->eh)(telnet,&local_58,telnet->ud);
  return;
}

Assistant:

void telnet_subnegotiation(telnet_t *telnet, unsigned char telopt,
		const char *buffer, size_t size) {
	unsigned char bytes[5];
	bytes[0] = TELNET_IAC;
	bytes[1] = TELNET_SB;
	bytes[2] = telopt;
	bytes[3] = TELNET_IAC;
	bytes[4] = TELNET_SE;

	_sendu(telnet, bytes, 3);
	telnet_send(telnet, buffer, size);
	_sendu(telnet, bytes + 3, 2);

#if defined(HAVE_ZLIB)
	/* if we're a proxy and we just sent the COMPRESS2 marker, we must
	 * make sure all further data is compressed if not already.
	 */
	if (telnet->flags & TELNET_FLAG_PROXY &&
			telopt == TELNET_TELOPT_COMPRESS2) {
		telnet_event_t ev;

		if (_init_zlib(telnet, 1, 1) != TELNET_EOK)
			return;

		/* notify app that compression was enabled */
		ev.type = TELNET_EV_COMPRESS;
		ev.compress.state = 1;
		telnet->eh(telnet, &ev, telnet->ud);
	}
#endif /* defined(HAVE_ZLIB) */
}